

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

SquareMatrix<double> __thiscall
qclab::dense::operator*(dense *this,SquareMatrix<double> *lhs,SquareMatrix<double> *rhs)

{
  long lVar1;
  double *pdVar2;
  double *__s;
  double *pdVar3;
  long lVar4;
  data_type extraout_RDX;
  double *pdVar5;
  long lVar6;
  double *pdVar7;
  int64_t k;
  long lVar8;
  ulong __n;
  double dVar9;
  SquareMatrix<double> SVar10;
  
  lVar1 = lhs->size_;
  if (lVar1 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
                 );
  }
  if (lVar1 == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x1e,"auto qclab::dense::init_unique_array(const int64_t) [T = double]");
  }
  __n = -(ulong)((ulong)(lVar1 * lVar1) >> 0x3d != 0) | lVar1 * lVar1 * 8;
  __s = (double *)operator_new__(__n);
  memset(__s,0,__n);
  pdVar2 = (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  if (lVar1 < 1) {
    (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
    if (pdVar2 == (double *)0x0) goto LAB_0010cc39;
  }
  else {
    pdVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    lVar4 = 0;
    do {
      lVar6 = 0;
      pdVar5 = pdVar2;
      do {
        dVar9 = __s[lVar4 * lVar1 + lVar6];
        lVar8 = 0;
        pdVar7 = pdVar5;
        do {
          dVar9 = dVar9 + *pdVar7 * pdVar3[lVar8];
          __s[lVar4 * lVar1 + lVar6] = dVar9;
          lVar8 = lVar8 + 1;
          pdVar7 = pdVar7 + lVar1;
        } while (lVar1 != lVar8);
        lVar6 = lVar6 + 1;
        pdVar5 = pdVar5 + 1;
      } while (lVar6 != lVar1);
      lVar4 = lVar4 + 1;
      pdVar3 = pdVar3 + lVar1;
    } while (lVar4 != lVar1);
    (lhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  }
  operator_delete__(pdVar2);
LAB_0010cc39:
  SquareMatrix<double>::SquareMatrix((SquareMatrix<double> *)this,lhs);
  SVar10.data_._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
       super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
       super__Head_base<0UL,_double_*,_false>._M_head_impl;
  SVar10.size_ = (size_type_conflict)this;
  return SVar10;
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }